

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_parse_url_path(connectdata *conn)

{
  curl_ftpfile cVar1;
  curl_hash *handle;
  _Bool _Var2;
  int iVar3;
  void *pvVar4;
  char *pcVar5;
  size_t sVar6;
  bool bVar7;
  int local_b8;
  char *local_b0;
  int local_a4;
  char *local_98;
  char *path;
  void *pvStack_68;
  int dlen;
  char **bigger;
  long lStack_58;
  int len;
  ssize_t absolute_dir;
  char *filename;
  char *cur_pos;
  char *path_to_use;
  char *slash_pos;
  ftp_conn *ftpc;
  FTP *ftp;
  SessionHandle *data;
  connectdata *conn_local;
  
  ftp = (FTP *)conn->data;
  ftpc = (ftp_conn *)(((SessionHandle *)ftp)->state).proto.http;
  slash_pos = (char *)&conn->proto;
  filename = (((SessionHandle *)ftp)->state).path;
  absolute_dir = 0;
  (conn->proto).ftpc.ctl_valid = false;
  (conn->proto).ftpc.cwdfail = false;
  cVar1 = (((SessionHandle *)ftp)->set).ftp_filemethod;
  cur_pos = filename;
  data = (SessionHandle *)conn;
  if (cVar1 != FTPFILE_MULTICWD) {
    if (cVar1 == FTPFILE_NOCWD) {
      if ((((((SessionHandle *)ftp)->state).path != (char *)0x0) &&
          (*(((SessionHandle *)ftp)->state).path != '\0')) &&
         (pcVar5 = (((SessionHandle *)ftp)->state).path,
         sVar6 = strlen((((SessionHandle *)ftp)->state).path), pcVar5[sVar6 - 1] != '/')) {
        absolute_dir = *(ssize_t *)&ftp[0x373].transfer;
      }
      goto LAB_001213fc;
    }
    if (cVar1 == FTPFILE_SINGLECWD) {
      if (*filename == '\0') {
        (conn->proto).ftpc.dirdepth = 0;
      }
      else {
        path_to_use = strrchr(filename,0x2f);
        if ((path_to_use == (char *)0x0) && (*filename != '\0')) {
          absolute_dir = (ssize_t)filename;
        }
        else {
          pvVar4 = (*Curl_ccalloc)(1,8);
          local_98 = filename;
          *(void **)(slash_pos + 0x78) = pvVar4;
          if (*(long *)(slash_pos + 0x78) == 0) {
            return CURLE_OUT_OF_MEMORY;
          }
          handle = (data->dns).hostcache;
          if (path_to_use == (char *)0x0) {
            local_98 = "/";
            local_a4 = 1;
          }
          else {
            local_a4 = curlx_sztosi((long)path_to_use - (long)filename);
          }
          pcVar5 = curl_easy_unescape(handle,local_98,local_a4,(int *)0x0);
          **(undefined8 **)(slash_pos + 0x78) = pcVar5;
          if (**(long **)(slash_pos + 0x78) == 0) {
            freedirs((ftp_conn *)slash_pos);
            return CURLE_OUT_OF_MEMORY;
          }
          slash_pos[0x80] = '\x01';
          slash_pos[0x81] = '\0';
          slash_pos[0x82] = '\0';
          slash_pos[0x83] = '\0';
          if (path_to_use == (char *)0x0) {
            local_b0 = filename;
          }
          else {
            local_b0 = path_to_use + 1;
          }
          absolute_dir = (ssize_t)local_b0;
        }
      }
      goto LAB_001213fc;
    }
  }
  (conn->proto).ftpc.dirdepth = 0;
  (conn->proto).ftpc.diralloc = 5;
  pvVar4 = (*Curl_ccalloc)((long)(conn->proto).ftpc.diralloc,8);
  *(void **)(slash_pos + 0x78) = pvVar4;
  if (*(long *)(slash_pos + 0x78) == 0) {
    return CURLE_OUT_OF_MEMORY;
  }
  iVar3 = curl_strequal(cur_pos,"/");
  if (iVar3 == 0) {
    while (path_to_use = strchr(filename,0x2f), path_to_use != (char *)0x0) {
      bVar7 = false;
      if (0 < (long)filename - *(long *)&ftp[0x373].transfer) {
        bVar7 = *(int *)(slash_pos + 0x80) == 0;
      }
      lStack_58 = (long)(int)(uint)bVar7;
      if (path_to_use == filename) {
        filename = path_to_use + 1;
      }
      else {
        bigger._4_4_ = curlx_sztosi((ssize_t)(path_to_use + (lStack_58 - (long)filename)));
        pcVar5 = curl_easy_unescape((data->dns).hostcache,filename + -lStack_58,bigger._4_4_,
                                    (int *)0x0);
        *(char **)(*(long *)(slash_pos + 0x78) + (long)*(int *)(slash_pos + 0x80) * 8) = pcVar5;
        if (*(long *)(*(long *)(slash_pos + 0x78) + (long)*(int *)(slash_pos + 0x80) * 8) == 0) {
          Curl_failf((SessionHandle *)ftp,"no memory");
          freedirs((ftp_conn *)slash_pos);
          return CURLE_OUT_OF_MEMORY;
        }
        _Var2 = isBadFtpString(*(char **)(*(long *)(slash_pos + 0x78) +
                                         (long)*(int *)(slash_pos + 0x80) * 8));
        if (_Var2) {
          (*Curl_cfree)(*(void **)(*(long *)(slash_pos + 0x78) +
                                  (long)*(int *)(slash_pos + 0x80) * 8));
          freedirs((ftp_conn *)slash_pos);
          return CURLE_URL_MALFORMAT;
        }
        filename = path_to_use + 1;
        iVar3 = *(int *)(slash_pos + 0x80);
        *(int *)(slash_pos + 0x80) = iVar3 + 1;
        if (*(int *)(slash_pos + 0x84) <= iVar3 + 1) {
          *(int *)(slash_pos + 0x84) = *(int *)(slash_pos + 0x84) << 1;
          pvStack_68 = (*Curl_crealloc)(*(void **)(slash_pos + 0x78),
                                        (long)*(int *)(slash_pos + 0x84) << 3);
          if (pvStack_68 == (void *)0x0) {
            freedirs((ftp_conn *)slash_pos);
            return CURLE_OUT_OF_MEMORY;
          }
          *(void **)(slash_pos + 0x78) = pvStack_68;
        }
      }
    }
    path_to_use = (char *)0x0;
  }
  else {
    filename = filename + 1;
    pcVar5 = (*Curl_cstrdup)("/");
    **(undefined8 **)(slash_pos + 0x78) = pcVar5;
    *(int *)(slash_pos + 0x80) = *(int *)(slash_pos + 0x80) + 1;
  }
  absolute_dir = (ssize_t)filename;
LAB_001213fc:
  if ((absolute_dir == 0) || (*(char *)absolute_dir == '\0')) {
    slash_pos[0x88] = '\0';
    slash_pos[0x89] = '\0';
    slash_pos[0x8a] = '\0';
    slash_pos[0x8b] = '\0';
    slash_pos[0x8c] = '\0';
    slash_pos[0x8d] = '\0';
    slash_pos[0x8e] = '\0';
    slash_pos[0x8f] = '\0';
  }
  else {
    pcVar5 = curl_easy_unescape((data->dns).hostcache,(char *)absolute_dir,0,(int *)0x0);
    *(char **)(slash_pos + 0x88) = pcVar5;
    if (*(long *)(slash_pos + 0x88) == 0) {
      freedirs((ftp_conn *)slash_pos);
      Curl_failf((SessionHandle *)ftp,"no memory");
      return CURLE_OUT_OF_MEMORY;
    }
    _Var2 = isBadFtpString(*(char **)(slash_pos + 0x88));
    if (_Var2) {
      freedirs((ftp_conn *)slash_pos);
      return CURLE_URL_MALFORMAT;
    }
  }
  if ((((ftp[0x1d].transfer & 0x100) == FTPTRANSFER_BODY) || (*(long *)(slash_pos + 0x88) != 0)) ||
     (*(int *)&(ftpc->pp).linestart_resp != 0)) {
    slash_pos[0x92] = '\0';
    if (*(long *)(slash_pos + 0x98) != 0) {
      pcVar5 = curl_easy_unescape((data->dns).hostcache,*(char **)&ftp[0x373].transfer,0,
                                  (int *)((long)&path + 4));
      if (pcVar5 == (char *)0x0) {
        freedirs((ftp_conn *)slash_pos);
        return CURLE_OUT_OF_MEMORY;
      }
      if (*(long *)(slash_pos + 0x88) == 0) {
        local_b8 = 0;
      }
      else {
        sVar6 = strlen(*(char **)(slash_pos + 0x88));
        local_b8 = curlx_uztosi(sVar6);
      }
      local_b8 = path._4_4_ - local_b8;
      path._4_4_ = local_b8;
      sVar6 = strlen(*(char **)(slash_pos + 0x98));
      iVar3 = curlx_uztosi(sVar6);
      if ((local_b8 == iVar3) &&
         (iVar3 = curl_strnequal(pcVar5,*(char **)(slash_pos + 0x98),(long)path._4_4_), iVar3 != 0))
      {
        Curl_infof((SessionHandle *)ftp,"Request has same path as previous transfer\n");
        slash_pos[0x92] = '\x01';
      }
      (*Curl_cfree)(pcVar5);
    }
    conn_local._4_4_ = CURLE_OK;
  }
  else {
    Curl_failf((SessionHandle *)ftp,"Uploading to a URL without a file name!");
    conn_local._4_4_ = CURLE_URL_MALFORMAT;
  }
  return conn_local._4_4_;
}

Assistant:

static
CURLcode ftp_parse_url_path(struct connectdata *conn)
{
  struct SessionHandle *data = conn->data;
  /* the ftp struct is already inited in ftp_connect() */
  struct FTP *ftp = data->state.proto.ftp;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  const char *slash_pos;  /* position of the first '/' char in curpos */
  const char *path_to_use = data->state.path;
  const char *cur_pos;
  const char *filename = NULL;

  cur_pos = path_to_use; /* current position in path. point at the begin
                            of next path component */

  ftpc->ctl_valid = FALSE;
  ftpc->cwdfail = FALSE;

  switch(data->set.ftp_filemethod) {
  case FTPFILE_NOCWD:
    /* fastest, but less standard-compliant */

    /*
      The best time to check whether the path is a file or directory is right
      here. so:

      the first condition in the if() right here, is there just in case
      someone decides to set path to NULL one day
   */
    if(data->state.path &&
       data->state.path[0] &&
       (data->state.path[strlen(data->state.path) - 1] != '/') )
      filename = data->state.path;  /* this is a full file path */
      /*
        ftpc->file is not used anywhere other than for operations on a file.
        In other words, never for directory operations.
        So we can safely leave filename as NULL here and use it as a
        argument in dir/file decisions.
      */
    break;

  case FTPFILE_SINGLECWD:
    /* get the last slash */
    if(!path_to_use[0]) {
      /* no dir, no file */
      ftpc->dirdepth = 0;
      break;
    }
    slash_pos=strrchr(cur_pos, '/');
    if(slash_pos || !*cur_pos) {
      ftpc->dirs = calloc(1, sizeof(ftpc->dirs[0]));
      if(!ftpc->dirs)
        return CURLE_OUT_OF_MEMORY;

      ftpc->dirs[0] = curl_easy_unescape(conn->data, slash_pos ? cur_pos : "/",
                                         slash_pos ?
                                         curlx_sztosi(slash_pos-cur_pos) : 1,
                                         NULL);
      if(!ftpc->dirs[0]) {
        freedirs(ftpc);
        return CURLE_OUT_OF_MEMORY;
      }
      ftpc->dirdepth = 1; /* we consider it to be a single dir */
      filename = slash_pos ? slash_pos+1 : cur_pos; /* rest is file name */
    }
    else
      filename = cur_pos;  /* this is a file name only */
    break;

  default: /* allow pretty much anything */
  case FTPFILE_MULTICWD:
    ftpc->dirdepth = 0;
    ftpc->diralloc = 5; /* default dir depth to allocate */
    ftpc->dirs = calloc(ftpc->diralloc, sizeof(ftpc->dirs[0]));
    if(!ftpc->dirs)
      return CURLE_OUT_OF_MEMORY;

    /* we have a special case for listing the root dir only */
    if(strequal(path_to_use, "/")) {
      cur_pos++; /* make it point to the zero byte */
      ftpc->dirs[0] = strdup("/");
      ftpc->dirdepth++;
    }
    else {
      /* parse the URL path into separate path components */
      while((slash_pos = strchr(cur_pos, '/')) != NULL) {
        /* 1 or 0 pointer offset to indicate absolute directory */
        ssize_t absolute_dir = ((cur_pos - data->state.path > 0) &&
                                (ftpc->dirdepth == 0))?1:0;

        /* seek out the next path component */
        if(slash_pos-cur_pos) {
          /* we skip empty path components, like "x//y" since the FTP command
             CWD requires a parameter and a non-existent parameter a) doesn't
             work on many servers and b) has no effect on the others. */
          int len = curlx_sztosi(slash_pos - cur_pos + absolute_dir);
          ftpc->dirs[ftpc->dirdepth] =
            curl_easy_unescape(conn->data, cur_pos - absolute_dir, len, NULL);
          if(!ftpc->dirs[ftpc->dirdepth]) { /* run out of memory ... */
            failf(data, "no memory");
            freedirs(ftpc);
            return CURLE_OUT_OF_MEMORY;
          }
          if(isBadFtpString(ftpc->dirs[ftpc->dirdepth])) {
            free(ftpc->dirs[ftpc->dirdepth]);
            freedirs(ftpc);
            return CURLE_URL_MALFORMAT;
          }
        }
        else {
          cur_pos = slash_pos + 1; /* jump to the rest of the string */
          continue;
        }

        cur_pos = slash_pos + 1; /* jump to the rest of the string */
        if(++ftpc->dirdepth >= ftpc->diralloc) {
          /* enlarge array */
          char **bigger;
          ftpc->diralloc *= 2; /* double the size each time */
          bigger = realloc(ftpc->dirs, ftpc->diralloc * sizeof(ftpc->dirs[0]));
          if(!bigger) {
            freedirs(ftpc);
            return CURLE_OUT_OF_MEMORY;
          }
          ftpc->dirs = bigger;
        }
      }
    }
    filename = cur_pos;  /* the rest is the file name */
    break;
  } /* switch */

  if(filename && *filename) {
    ftpc->file = curl_easy_unescape(conn->data, filename, 0, NULL);
    if(NULL == ftpc->file) {
      freedirs(ftpc);
      failf(data, "no memory");
      return CURLE_OUT_OF_MEMORY;
    }
    if(isBadFtpString(ftpc->file)) {
      freedirs(ftpc);
      return CURLE_URL_MALFORMAT;
    }
  }
  else
    ftpc->file=NULL; /* instead of point to a zero byte, we make it a NULL
                       pointer */

  if(data->set.upload && !ftpc->file && (ftp->transfer == FTPTRANSFER_BODY)) {
    /* We need a file name when uploading. Return error! */
    failf(data, "Uploading to a URL without a file name!");
    return CURLE_URL_MALFORMAT;
  }

  ftpc->cwddone = FALSE; /* default to not done */

  if(ftpc->prevpath) {
    /* prevpath is "raw" so we convert the input path before we compare the
       strings */
    int dlen;
    char *path = curl_easy_unescape(conn->data, data->state.path, 0, &dlen);
    if(!path) {
      freedirs(ftpc);
      return CURLE_OUT_OF_MEMORY;
    }

    dlen -= ftpc->file?curlx_uztosi(strlen(ftpc->file)):0;
    if((dlen == curlx_uztosi(strlen(ftpc->prevpath))) &&
       strnequal(path, ftpc->prevpath, dlen)) {
      infof(data, "Request has same path as previous transfer\n");
      ftpc->cwddone = TRUE;
    }
    free(path);
  }

  return CURLE_OK;
}